

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall Plane::Plane(Plane *this,Vector3f *normal,float d,Material *m)

{
  Material *m_local;
  float d_local;
  Vector3f *normal_local;
  Plane *this_local;
  
  Object3D::Object3D(&this->super_Object3D,m);
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Plane_001709e8;
  Vector3f::Vector3f(&this->_normal,normal);
  this->_d = d;
  return;
}

Assistant:

Plane(const Vector3f &normal,
          float d,
          Material *m) :
            Object3D(m),
            _normal(normal),
            _d(d) {
    }